

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_timeout.cxx
# Opt level: O0

void __thiscall nuraft::raft_server::restart_election_timer(raft_server *this)

{
  bool bVar1;
  srv_role sVar2;
  int iVar3;
  element_type *peVar4;
  element_type *peVar5;
  element_type *peVar6;
  long in_RDI;
  unique_lock<std::recursive_mutex> guard;
  undefined7 in_stack_ffffffffffffff28;
  undefined1 in_stack_ffffffffffffff2f;
  raft_server *in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff3c;
  raft_server *in_stack_ffffffffffffff40;
  string local_88 [36];
  undefined4 local_64;
  string local_50 [52];
  undefined4 local_1c;
  
  std::unique_lock<std::recursive_mutex>::unique_lock
            ((unique_lock<std::recursive_mutex> *)in_stack_ffffffffffffff30,
             (mutex_type *)CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28));
  bVar1 = std::atomic::operator_cast_to_bool
                    ((atomic<bool> *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
  if ((bVar1) ||
     (sVar2 = std::atomic::operator_cast_to_srv_role((atomic<nuraft::srv_role> *)0x1fb6a6),
     sVar2 == leader)) {
    local_1c = 1;
  }
  else {
    std::__shared_ptr_access<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x1fb6cc);
    bVar1 = srv_state::is_election_timer_allowed((srv_state *)0x1fb6d4);
    if (!bVar1) {
      std::__shared_ptr_access<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                 )0x1fb6f5);
      srv_state::allow_election_timer
                ((srv_state *)in_stack_ffffffffffffff30,(bool)in_stack_ffffffffffffff2f);
      std::unique_ptr<nuraft::context,_std::default_delete<nuraft::context>_>::operator->
                ((unique_ptr<nuraft::context,_std::default_delete<nuraft::context>_> *)0x1fb715);
      peVar4 = std::__shared_ptr_access<nuraft::state_mgr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<nuraft::state_mgr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x1fb71d);
      peVar5 = std::__shared_ptr_access<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator*((__shared_ptr_access<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)in_stack_ffffffffffffff30);
      (*peVar4->_vptr_state_mgr[4])(peVar4,peVar5);
    }
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 400));
    if (bVar1) {
      bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x318));
      if (bVar1) {
        peVar6 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x1fb7a6);
        iVar3 = (*peVar6->_vptr_logger[7])();
        if (5 < iVar3) {
          peVar6 = std::
                   __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x1fb7d6);
          msg_if_given_abi_cxx11_((char *)local_50,"cancel existing timer");
          (*peVar6->_vptr_logger[8])
                    (peVar6,6,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_timeout.cxx"
                     ,"restart_election_timer",0xb0,local_50);
          std::__cxx11::string::~string(local_50);
        }
      }
      cancel_task(in_stack_ffffffffffffff30,
                  (ptr<delayed_task> *)CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28)
                 );
    }
    else {
      local_64 = 1;
      cs_new<nuraft::timer_task<void>,std::function<void()>&,nuraft::timer_task_type>
                ((function<void_()> *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                 (timer_task_type *)in_stack_ffffffffffffff30);
      std::shared_ptr<nuraft::delayed_task>::operator=
                ((shared_ptr<nuraft::delayed_task> *)in_stack_ffffffffffffff30,
                 (shared_ptr<nuraft::timer_task<void>_> *)
                 CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28));
      std::shared_ptr<nuraft::timer_task<void>_>::~shared_ptr
                ((shared_ptr<nuraft::timer_task<void>_> *)0x1fb8b6);
    }
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x318));
    if (bVar1) {
      peVar6 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1fb8e1);
      iVar3 = (*peVar6->_vptr_logger[7])();
      if (5 < iVar3) {
        in_stack_ffffffffffffff40 =
             (raft_server *)
             std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1fb911);
        msg_if_given_abi_cxx11_((char *)local_88,"re-schedule election timer");
        (*((_func_int **)
          (((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
             *)&in_stack_ffffffffffffff40->_vptr_raft_server)->__d).__r)[8])
                  (in_stack_ffffffffffffff40,6,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_timeout.cxx"
                   ,"restart_election_timer",0xb8,local_88);
        std::__cxx11::string::~string(local_88);
      }
    }
    timer_helper::reset((timer_helper *)in_stack_ffffffffffffff40);
    in_stack_ffffffffffffff30 = (raft_server *)(in_RDI + 400);
    iVar3 = std::function<int_()>::operator()((function<int_()> *)in_stack_ffffffffffffff30);
    schedule_task(in_stack_ffffffffffffff40,
                  (ptr<delayed_task> *)CONCAT44(iVar3,in_stack_ffffffffffffff38),
                  (int32)((ulong)in_stack_ffffffffffffff30 >> 0x20));
    local_1c = 0;
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock
            ((unique_lock<std::recursive_mutex> *)in_stack_ffffffffffffff30);
  return;
}

Assistant:

void raft_server::restart_election_timer() {
    // don't start the election timer while this server is still catching up the logs
    // or this server is the leader
    recur_lock(lock_);
    if (catching_up_ || role_ == srv_role::leader) {
        return;
    }

    // If election timer was not allowed, clear the flag.
    if (!state_->is_election_timer_allowed()) {
        state_->allow_election_timer(true);
        ctx_->state_mgr_->save_state(*state_);
    }

    if (election_task_) {
        p_tr("cancel existing timer");
        cancel_task(election_task_);
    } else {
        election_task_ = cs_new< timer_task<void> >
                               ( election_exec_,
                                 timer_task_type::election_timer );
    }

    p_tr("re-schedule election timer");
    last_election_timer_reset_.reset();

    schedule_task(election_task_, rand_timeout_());
}